

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O0

Validator * __thiscall CLI::Validator::description(Validator *this,string *validator_desc)

{
  string local_38 [32];
  string *local_18;
  string *validator_desc_local;
  Validator *this_local;
  
  local_18 = validator_desc;
  validator_desc_local = (string *)this;
  ::std::__cxx11::string::string(local_38,(string *)validator_desc);
  ::std::function<std::__cxx11::string()>::operator=
            ((function<std::__cxx11::string()> *)this,(anon_class_32_1_5ff8519c *)local_38);
  description(std::__cxx11::string)::{lambda()#1}::~basic_string((_lambda___1_ *)local_38);
  return this;
}

Assistant:

Validator &description(std::string validator_desc) {
        desc_function_ = [validator_desc]() { return validator_desc; };
        return *this;
    }